

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cShaderAtomicCountersTests.cpp
# Opt level: O3

long __thiscall gl4cts::NegativeArray::Run(NegativeArray *this)

{
  CallLogWrapper *this_00;
  GLuint GVar1;
  char *format;
  GLint status;
  GLint status_comp;
  char *glsl_fs1;
  char *glsl_vs;
  int local_40;
  int local_3c;
  char *local_38;
  char *local_30;
  
  local_30 = 
  "#version 430 core\nlayout(location = 0) in vec4 i_vertex;\nvoid main() {\n  gl_Position = i_vertex;\n}"
  ;
  local_38 = 
  "#version 430 core\nlayout(location = 0) out uvec4 o_color[4];\nlayout(binding = 0, offset = 0) uniform atomic_uint ac_counter0[3];\nvoid main() {\n  o_color[0] = uvec4(atomicCounterIncrement(ac_counter0));\n  o_color[1] = uvec4(atomicCounterDecrement(ac_counter0));\n}"
  ;
  this_00 = &(this->super_SACSubcaseBase).super_SubcaseBase.super_GLWrapper.super_CallLogWrapper;
  GVar1 = glu::CallLogWrapper::glCreateProgram(this_00);
  this->prog_ = GVar1;
  GVar1 = glu::CallLogWrapper::glCreateShader(this_00,0x8b31);
  glu::CallLogWrapper::glAttachShader(this_00,this->prog_,GVar1);
  glu::CallLogWrapper::glShaderSource(this_00,GVar1,1,&local_30,(GLint *)0x0);
  glu::CallLogWrapper::glCompileShader(this_00,GVar1);
  glu::CallLogWrapper::glGetShaderiv(this_00,GVar1,0x8b81,&local_3c);
  if (local_3c == 1) {
    glu::CallLogWrapper::glDeleteShader(this_00,GVar1);
    GVar1 = glu::CallLogWrapper::glCreateShader(this_00,0x8b30);
    glu::CallLogWrapper::glAttachShader(this_00,this->prog_,GVar1);
    glu::CallLogWrapper::glShaderSource(this_00,GVar1,1,&local_38,(GLint *)0x0);
    glu::CallLogWrapper::glCompileShader(this_00,GVar1);
    glu::CallLogWrapper::glGetShaderiv(this_00,GVar1,0x8b81,&local_3c);
    glu::CallLogWrapper::glDeleteShader(this_00,GVar1);
    glu::CallLogWrapper::glLinkProgram(this_00,this->prog_);
    glu::CallLogWrapper::glGetProgramiv(this_00,this->prog_,0x8b82,&local_40);
    if (local_3c != 1) {
      return 0;
    }
    if (local_40 != 1) {
      return 0;
    }
    format = "Expected error during fragment shader compilation or linking.";
  }
  else {
    format = "Unexpected error during vertex shader compilation.";
  }
  gl4cts::anon_unknown_0::Output(format);
  return -1;
}

Assistant:

virtual long Run()
	{

		// create program
		const char* glsl_vs = "#version 430 core" NL "layout(location = 0) in vec4 i_vertex;" NL "void main() {" NL
							  "  gl_Position = i_vertex;" NL "}";

		const char* glsl_fs1 = "#version 430 core" NL "layout(location = 0) out uvec4 o_color[4];" NL
							   "layout(binding = 0, offset = 0) uniform atomic_uint ac_counter0[3];" NL
							   "void main() {" NL "  o_color[0] = uvec4(atomicCounterIncrement(ac_counter0));" NL
							   "  o_color[1] = uvec4(atomicCounterDecrement(ac_counter0));" NL "}";

		prog_ = glCreateProgram();

		GLuint sh = glCreateShader(GL_VERTEX_SHADER);
		glAttachShader(prog_, sh);
		glShaderSource(sh, 1, &glsl_vs, NULL);
		glCompileShader(sh);
		GLint status_comp;
		glGetShaderiv(sh, GL_COMPILE_STATUS, &status_comp);
		if (status_comp != GL_TRUE)
		{
			Output("Unexpected error during vertex shader compilation.");
			return ERROR;
		}
		glDeleteShader(sh);

		sh = glCreateShader(GL_FRAGMENT_SHADER);
		glAttachShader(prog_, sh);
		glShaderSource(sh, 1, &glsl_fs1, NULL);
		glCompileShader(sh);
		glGetShaderiv(sh, GL_COMPILE_STATUS, &status_comp);
		glDeleteShader(sh);

		GLint status;
		glLinkProgram(prog_);
		glGetProgramiv(prog_, GL_LINK_STATUS, &status);
		if (status_comp == GL_TRUE && status == GL_TRUE)
		{
			Output("Expected error during fragment shader compilation or linking.");
			return ERROR;
		}
		return NO_ERROR;
	}